

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-open.c
# Opt level: O2

void write_cb(uv_write_t *req,int status)

{
  FILE *__stream;
  undefined8 uVar1;
  
  __stream = _stderr;
  if (req == (uv_write_t *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
            ,0x65,"req","!=","NULL",0,"!=",0);
    abort();
  }
  if (status == 0) {
    bytes_sent_done = bytes_sent_done + 0x2728000;
    write_cb_called = write_cb_called + 1;
    return;
  }
  uVar1 = uv_strerror(status);
  fprintf(__stream,"uv_write error: %s\n",uVar1);
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-writealot.c"
          ,0x69,"0");
  abort();
}

Assistant:

static void write_cb(uv_write_t* req, int status) {
  ASSERT_NOT_NULL(req);

  if (status) {
    fprintf(stderr, "uv_write error: %s\n", uv_strerror(status));
    ASSERT(0);
  }

  write_cb_called++;
}